

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall
mkvmuxer::Cluster::AddFrameWithAdditional
          (Cluster *this,uint8_t *data,uint64_t length,uint8_t *additional,
          uint64_t additional_length,uint64_t add_id,uint64_t track_number,uint64_t abs_timecode,
          bool is_key)

{
  bool bVar1;
  Frame local_98;
  
  if (additional_length != 0 && additional != (uint8_t *)0x0) {
    Frame::Frame(&local_98);
    bVar1 = Frame::Init(&local_98,data,length);
    if ((bVar1) &&
       (bVar1 = Frame::AddAdditionalData(&local_98,additional,additional_length,add_id), bVar1)) {
      local_98.track_number_ = track_number;
      local_98.timestamp_ = abs_timecode;
      local_98.is_key_ = is_key;
      bVar1 = QueueOrWriteFrame(this,&local_98);
    }
    else {
      bVar1 = false;
    }
    Frame::~Frame(&local_98);
    return bVar1;
  }
  return false;
}

Assistant:

bool Cluster::AddFrameWithAdditional(const uint8_t* data, uint64_t length,
                                     const uint8_t* additional,
                                     uint64_t additional_length,
                                     uint64_t add_id, uint64_t track_number,
                                     uint64_t abs_timecode, bool is_key) {
  if (!additional || additional_length == 0) {
    return false;
  }
  Frame frame;
  if (!frame.Init(data, length) ||
      !frame.AddAdditionalData(additional, additional_length, add_id)) {
    return false;
  }
  frame.set_track_number(track_number);
  frame.set_timestamp(abs_timecode);
  frame.set_is_key(is_key);
  return QueueOrWriteFrame(&frame);
}